

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

shared_ptr<vmips::CFGNode> __thiscall vmips::Function::entry(Function *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Function *in_RSI;
  shared_ptr<vmips::CFGNode> sVar1;
  undefined1 local_48 [8];
  string local_40;
  
  next_name_abi_cxx11_((string *)(local_48 + 8),in_RSI);
  std::make_shared<vmips::CFGNode,vmips::Function*,std::__cxx11::string>
            ((Function **)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back(&in_RSI->blocks,(value_type *)this);
  std::__shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(in_RSI->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2> *)this);
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::CFGNode>)
         sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CFGNode> Function::entry() {
    auto ret = std::make_shared<CFGNode>(this, next_name());
    blocks.push_back(ret);
    switch_to(ret);
    return ret;
}